

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_cmdline.cpp
# Opt level: O2

bool __thiscall Omega_h::CmdLine::parse(CmdLine *this,int *p_argc,char **argv,bool should_print)

{
  pointer puVar1;
  bool bVar2;
  bool bVar3;
  int i_00;
  ostream *poVar4;
  undefined7 in_register_00000009;
  pointer puVar5;
  pointer puVar6;
  size_t i;
  pointer puVar7;
  ulong uVar8;
  allocator local_65;
  undefined4 local_64;
  uint local_60;
  int local_5c;
  CmdLine *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  i_00 = 1;
  local_60 = (uint)should_print;
  local_64 = (undefined4)CONCAT71(in_register_00000009,!should_print);
  local_58 = this;
  do {
    local_5c = i_00;
LAB_0024d60c:
    do {
      if (*p_argc <= i_00) {
        uVar8 = this->nargs_parsed_;
        puVar6 = (this->args_).
                 super__Vector_base<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar5 = (this->args_).
                 super__Vector_base<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        bVar3 = (ulong)((long)puVar5 - (long)puVar6 >> 3) <= uVar8;
        if ((char)local_64 == '\0' && !bVar3) {
          for (; uVar8 < (ulong)((long)puVar5 - (long)puVar6 >> 3); uVar8 = uVar8 + 1) {
            poVar4 = std::operator<<((ostream *)&std::cout,"missing required argument <");
            poVar4 = std::operator<<(poVar4,(string *)
                                            ((long)(this->args_).
                                                                                                      
                                                  super__Vector_base<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar8].
                                                  _M_t.
                                                  super___uniq_ptr_impl<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>
                                            + 8));
            std::operator<<(poVar4,">\n");
            puVar6 = (this->args_).
                     super__Vector_base<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            puVar5 = (this->args_).
                     super__Vector_base<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          }
LAB_0024d727:
          bVar3 = false;
        }
        return bVar3;
      }
      puVar1 = (this->flags_).
               super__Vector_base<std::unique_ptr<Omega_h::CmdLineFlag,_std::default_delete<Omega_h::CmdLineFlag>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineFlag,_std::default_delete<Omega_h::CmdLineFlag>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      bVar3 = false;
      for (puVar7 = (this->flags_).
                    super__Vector_base<std::unique_ptr<Omega_h::CmdLineFlag,_std::default_delete<Omega_h::CmdLineFlag>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineFlag,_std::default_delete<Omega_h::CmdLineFlag>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; this = local_58, puVar7 != puVar1;
          puVar7 = puVar7 + 1) {
        bVar2 = std::operator==(&(((puVar7->_M_t).
                                   super___uniq_ptr_impl<Omega_h::CmdLineFlag,_std::default_delete<Omega_h::CmdLineFlag>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_Omega_h::CmdLineFlag_*,_std::default_delete<Omega_h::CmdLineFlag>_>
                                   .super__Head_base<0UL,_Omega_h::CmdLineFlag_*,_false>.
                                  _M_head_impl)->super_CmdLineItem).name_,argv[i_00]);
        if (bVar2) {
          bVar2 = CmdLineItem::parse(&((puVar7->_M_t).
                                       super___uniq_ptr_impl<Omega_h::CmdLineFlag,_std::default_delete<Omega_h::CmdLineFlag>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_Omega_h::CmdLineFlag_*,_std::default_delete<Omega_h::CmdLineFlag>_>
                                       .super__Head_base<0UL,_Omega_h::CmdLineFlag_*,_false>.
                                      _M_head_impl)->super_CmdLineItem,p_argc,argv,i_00,
                                     SUB41(local_60,0));
          if (!bVar2 && (char)local_64 == '\0') {
            poVar4 = std::operator<<((ostream *)&std::cout,"failed to parse flag ");
            poVar4 = std::operator<<(poVar4,(string *)
                                            &(((puVar7->_M_t).
                                               super___uniq_ptr_impl<Omega_h::CmdLineFlag,_std::default_delete<Omega_h::CmdLineFlag>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_Omega_h::CmdLineFlag_*,_std::default_delete<Omega_h::CmdLineFlag>_>
                                               .super__Head_base<0UL,_Omega_h::CmdLineFlag_*,_false>
                                              ._M_head_impl)->super_CmdLineItem).name_);
            std::operator<<(poVar4,'\n');
            goto LAB_0024d727;
          }
          bVar3 = true;
          if (!bVar2) goto LAB_0024d727;
        }
      }
    } while (bVar3);
    std::__cxx11::string::string((string *)&local_50,"--help",&local_65);
    bVar3 = std::operator==(&local_50,argv[i_00]);
    std::__cxx11::string::~string((string *)&local_50);
    if (!bVar3) {
      puVar6 = (this->args_).
               super__Vector_base<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->args_).
                        super__Vector_base<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)puVar6 >> 3) <=
          this->nargs_parsed_) goto LAB_0024d6ef;
      bVar3 = CmdLineItem::parse((CmdLineItem *)
                                 puVar6[this->nargs_parsed_]._M_t.
                                 super___uniq_ptr_impl<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>
                                 ,p_argc,argv,i_00,SUB41(local_60,0));
      if (bVar3) {
        this->nargs_parsed_ = this->nargs_parsed_ + 1;
      }
      goto LAB_0024d60c;
    }
    this->parsed_help_ = true;
LAB_0024d6ef:
    i_00 = local_5c + 1;
  } while( true );
}

Assistant:

bool CmdLine::parse(int* p_argc, char** argv, bool should_print) {
  for (int i = 1; i < *p_argc;) {
    bool parsed_by_flag = false;
    for (auto const& flag : flags_) {
      if (flag->name() == argv[i]) {
        if (!flag->parse(p_argc, argv, i, should_print)) {
          if (should_print) {
            std::cout << "failed to parse flag " << flag->name() << '\n';
          }
          return false;
        }
        parsed_by_flag = true;
      }
    }
    if (parsed_by_flag) {
      continue;
    } else if (std::string("--help") == argv[i]) {
      parsed_help_ = true;
      ++i;
    } else if (args_.size() > nargs_parsed_) {
      if (args_[nargs_parsed_]->parse(p_argc, argv, i, should_print)) {
        ++nargs_parsed_;
      }
    } else {
      ++i;
    }
  }
  if (nargs_parsed_ < args_.size()) {
    if (should_print) {
      for (std::size_t i = nargs_parsed_; i < args_.size(); ++i) {
        std::cout << "missing required argument <" << args_[i]->name() << ">\n";
      }
    }
    return false;
  }
  return true;
}